

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O1

ssize_t __thiscall DomDate::read(DomDate *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  long lVar3;
  undefined4 in_register_00000034;
  QString *pQVar4;
  long in_FS_OFFSET;
  QStringView QVar5;
  QStringView QVar6;
  QStringView QVar7;
  QStringView QVar8;
  QStringView QVar9;
  QStringView QVar10;
  QStringBuilder<QLatin1String,_const_QStringView_&> local_78;
  QString local_60;
  QStringView local_48;
  long local_38;
  
  pQVar4 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QXmlStreamReader::error();
  if (iVar1 == 0) {
    iVar1 = 0;
    do {
      iVar2 = QXmlStreamReader::readNext();
      if (iVar2 == 4) {
        local_48.m_size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_48.m_data = (storage_type_conflict *)&DAT_aaaaaaaaaaaaaaaa;
        local_48 = (QStringView)QXmlStreamReader::name();
        QVar8.m_data = L"year";
        QVar8.m_size = 4;
        iVar2 = QtPrivate::compareStrings(local_48,QVar8,CaseInsensitive);
        if (iVar2 == 0) {
          QXmlStreamReader::readElementText(&local_60,pQVar4,0);
          QVar5.m_data = local_60.d.ptr;
          QVar5.m_size = local_60.d.size;
          lVar3 = QString::toIntegral_helper(QVar5,(bool *)0x0,10);
          iVar2 = (int)lVar3;
          if ((int)lVar3 != lVar3) {
            iVar2 = iVar1;
          }
          *(byte *)&this->m_children = (byte)this->m_children | 1;
          this->m_year = iVar2;
        }
        else {
          QVar9.m_data = L"month";
          QVar9.m_size = 5;
          iVar2 = QtPrivate::compareStrings(local_48,QVar9,CaseInsensitive);
          if (iVar2 == 0) {
            QXmlStreamReader::readElementText(&local_60,pQVar4,0);
            QVar6.m_data = local_60.d.ptr;
            QVar6.m_size = local_60.d.size;
            lVar3 = QString::toIntegral_helper(QVar6,(bool *)0x0,10);
            iVar2 = (int)lVar3;
            if ((int)lVar3 != lVar3) {
              iVar2 = iVar1;
            }
            *(byte *)&this->m_children = (byte)this->m_children | 2;
            this->m_month = iVar2;
          }
          else {
            QVar10.m_data = L"day";
            QVar10.m_size = 3;
            iVar2 = QtPrivate::compareStrings(local_48,QVar10,CaseInsensitive);
            if (iVar2 == 0) {
              QXmlStreamReader::readElementText(&local_60,pQVar4,0);
              QVar7.m_data = local_60.d.ptr;
              QVar7.m_size = local_60.d.size;
              lVar3 = QString::toIntegral_helper(QVar7,(bool *)0x0,10);
              iVar2 = (int)lVar3;
              if ((int)lVar3 != lVar3) {
                iVar2 = iVar1;
              }
              *(byte *)&this->m_children = (byte)this->m_children | 4;
              this->m_day = iVar2;
            }
            else {
              local_78.a.m_size = 0x13;
              local_78.a.m_data = "Unexpected element ";
              local_78.b = &local_48;
              QStringBuilder<QLatin1String,_const_QStringView_&>::convertTo<QString>
                        (&local_60,&local_78);
              QXmlStreamReader::raiseError(pQVar4);
            }
          }
        }
        if (&(local_60.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_60.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_60.d.d)->super_QArrayData,2,0x10);
          }
        }
      }
      else if (iVar2 == 5) break;
      iVar2 = QXmlStreamReader::error();
    } while (iVar2 == 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomDate::read(QXmlStreamReader &reader)
{
    while (!reader.hasError()) {
        switch (reader.readNext()) {
        case QXmlStreamReader::StartElement : {
            const auto tag = reader.name();
            if (!tag.compare(u"year"_s, Qt::CaseInsensitive)) {
                setElementYear(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"month"_s, Qt::CaseInsensitive)) {
                setElementMonth(reader.readElementText().toInt());
                continue;
            }
            if (!tag.compare(u"day"_s, Qt::CaseInsensitive)) {
                setElementDay(reader.readElementText().toInt());
                continue;
            }
            reader.raiseError("Unexpected element "_L1 + tag);
        }
            break;
        case QXmlStreamReader::EndElement :
            return;
        default :
            break;
        }
    }
}